

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int find_curlybracket(char **string)

{
  byte bVar1;
  int iVar2;
  char *tstr;
  byte *local_20;
  
  local_20 = (byte *)*string;
  do {
    while (bVar1 = *local_20, bVar1 < 0x28) {
      if (bVar1 == 0x22) {
        local_20 = local_20 + 2;
        while( true ) {
          if (local_20[-1] == 0) {
            return 1;
          }
          if (local_20[-1] == 0x22) break;
          local_20 = local_20 + 1;
        }
      }
      else if (bVar1 == 0x27) {
        local_20 = local_20 + 2;
        while( true ) {
          if (local_20[-1] == 0) {
            return 1;
          }
          if (local_20[-1] == 0x27) break;
          local_20 = local_20 + 1;
        }
      }
      else {
        if (bVar1 == 0) {
          return 1;
        }
LAB_0010d5b6:
        local_20 = local_20 + 1;
      }
    }
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x28) {
        local_20 = local_20 + 1;
        iVar2 = find_paren((char **)&local_20);
      }
      else {
        if (bVar1 != 0x5b) goto LAB_0010d5b6;
        local_20 = local_20 + 1;
        iVar2 = find_bracket((char **)&local_20);
      }
    }
    else {
      if (bVar1 != 0x7b) {
        if (bVar1 == 0x7d) {
          *string = (char *)(local_20 + 1);
          return 0;
        }
        goto LAB_0010d5b6;
      }
      local_20 = local_20 + 1;
      iVar2 = find_curlybracket((char **)&local_20);
    }
    if (iVar2 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int find_curlybracket(char **string)

/*  
    look for the closing curly bracket character in the input string
*/
{
    char *tstr;

    tstr = *string;

    while (*tstr) {
        if (*tstr == '}') { /* found the closing curly bracket */
           *string = tstr + 1;  /* set pointer to next char */
           return(0); 
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(1);  /* opps, didn't find the closing character */
}